

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.cc
# Opt level: O1

Flags * __thiscall
flow::util::Flags::defineFloat
          (Flags *this,string *longOpt,char shortOpt,string *valuePlaceholder,string *helpText,
          optional<float> defaultValue,function<void_(float)> callback)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [32];
  bool local_88;
  string *local_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  if (((ulong)defaultValue.super__Optional_base<float,_true,_true>._M_payload.
              super__Optional_payload_base<float> >> 0x20 & 1) == 0) {
    local_88 = false;
  }
  else {
    local_80 = valuePlaceholder;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_c8,vsnprintf,0x3a,"%f",
               (double)defaultValue.super__Optional_base<float,_true,_true>._M_payload.
                       super__Optional_payload_base<float>._M_payload._M_value);
    local_a8._0_8_ = local_a8 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
      local_a8._24_8_ = local_c8.field_2._8_8_;
    }
    else {
      local_a8._0_8_ = local_c8._M_dataplus._M_p;
    }
    local_a8._17_7_ = local_c8.field_2._M_allocated_capacity._1_7_;
    local_a8[0x10] = local_c8.field_2._M_local_buf[0];
    local_a8._8_8_ = local_c8._M_string_length;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    local_88 = true;
    valuePlaceholder = local_80;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  std::function<void_(float)>::function
            ((function<void_(float)> *)&local_78,
             (function<void_(float)> *)callback.super__Function_base._M_functor._M_unused._0_8_);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_58._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x18) = uStack_60;
  if (local_68 != (code *)0x0) {
    *(void **)local_58._M_unused._0_8_ = local_78._M_unused._M_object;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_78._8_8_;
    *(code **)((long)local_58._M_unused._0_8_ + 0x10) = local_68;
    local_68 = (code *)0x0;
    uStack_60 = 0;
  }
  pcStack_40 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/util/Flags.cc:218:7)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/util/Flags.cc:218:7)>
             ::_M_manager;
  define(this,longOpt,shortOpt,false,Float,valuePlaceholder,helpText,
         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_a8,
         (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_88 == true) {
    local_88 = false;
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
  }
  if ((((ulong)defaultValue.super__Optional_base<float,_true,_true>._M_payload.
               super__Optional_payload_base<float> >> 0x20 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2)) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return this;
}

Assistant:

Flags& Flags::defineFloat(
    const std::string& longOpt,
    char shortOpt,
    const std::string& valuePlaceholder,
    const std::string& helpText,
    std::optional<float> defaultValue,
    std::function<void(float)> callback) {

  return define(
      longOpt, shortOpt, false, FlagType::Float, valuePlaceholder,
      helpText, defaultValue.has_value() ? std::make_optional(std::to_string(*defaultValue))
                                         : std::nullopt,
      [=](const std::string& value) {
        if (callback) {
          callback(std::stof(value));
        }
      });
}